

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void walIndexWriteHdr(Wal *pWal)

{
  WalIndexHdr *__dest;
  int nCksum;
  WalIndexHdr *aHdr;
  Wal *pWal_local;
  
  __dest = walIndexHdr(pWal);
  (pWal->hdr).isInit = '\x01';
  (pWal->hdr).iVersion = 0x2de218;
  walChecksumBytes(1,(u8 *)&pWal->hdr,0x28,(u32 *)0x0,(pWal->hdr).aCksum);
  memcpy(__dest + 1,&pWal->hdr,0x30);
  walShmBarrier(pWal);
  memcpy(__dest,&pWal->hdr,0x30);
  return;
}

Assistant:

static SQLITE_NO_TSAN void walIndexWriteHdr(Wal *pWal){
  volatile WalIndexHdr *aHdr = walIndexHdr(pWal);
  const int nCksum = offsetof(WalIndexHdr, aCksum);

  assert( pWal->writeLock );
  pWal->hdr.isInit = 1;
  pWal->hdr.iVersion = WALINDEX_MAX_VERSION;
  walChecksumBytes(1, (u8*)&pWal->hdr, nCksum, 0, pWal->hdr.aCksum);
  /* Possible TSAN false-positive.  See tag-20200519-1 */
  memcpy((void*)&aHdr[1], (const void*)&pWal->hdr, sizeof(WalIndexHdr));
  walShmBarrier(pWal);
  memcpy((void*)&aHdr[0], (const void*)&pWal->hdr, sizeof(WalIndexHdr));
}